

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void assert_solvers_result<double,std::less<double>>
               (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *cost_matrix,double expected_cost,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *expected_assignment,
               less<double> *cost_comparator)

{
  _func_double_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr_less<double>_ptr
  *local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  Testing Hungarian solver",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  local_30 = hungarian_algorithm::
             solve<double,unsigned_long,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::less<double>>
  ;
  assert_solver_result<double(*)(boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::less<double>const&),double,std::less<double>>
            (&local_30,cost_matrix,expected_cost,expected_assignment,cost_comparator);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  Testing brute force solver",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  local_30 = hungarian_algorithm::
             solveBruteForce<double,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::less<double>>
  ;
  assert_solver_result<double(*)(boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::less<double>const&),double,std::less<double>>
            (&local_30,cost_matrix,expected_cost,expected_assignment,cost_comparator);
  return;
}

Assistant:

void assert_solvers_result(const ublas::matrix<Cost>& cost_matrix, const Cost expected_cost,
                           const std::vector<std::size_t>& expected_assignment,
                           const CostComparator& cost_comparator)
{
  typedef Cost SolvingFunction(const ublas::matrix<Cost>&, const std::size_t, const std::size_t,
                               std::vector<std::size_t>&, const CostComparator&);
  std::cout << "  Testing Hungarian solver" << std::endl;
  assert_solver_result(static_cast<SolvingFunction*>(&hungarian_algorithm::solve), cost_matrix, expected_cost,
                       expected_assignment, cost_comparator);
  std::cout << "  Testing brute force solver" << std::endl;
  assert_solver_result(static_cast<SolvingFunction*>(&hungarian_algorithm::solveBruteForce), cost_matrix, expected_cost,
                       expected_assignment, cost_comparator);
}